

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.h
# Opt level: O3

void __thiscall MeCab::Dictionary::~Dictionary(Dictionary *this)

{
  ~Dictionary(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~Dictionary() { this->close(); }